

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomDepends
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs)

{
  bool bVar1;
  reference cc_00;
  string local_108;
  undefined1 local_e8 [8];
  cmCustomCommandGenerator ccg;
  cmCustomCommand *cc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *__range1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  __end1 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(ccs);
  cc = (cmCustomCommand *)std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(ccs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                                *)&cc);
    if (!bVar1) break;
    cc_00 = __gnu_cxx::
            __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
            ::operator*(&__end1);
    ccg.WorkingDirectory.field_2._8_8_ = cc_00;
    std::__cxx11::string::string
              ((string *)&local_108,(string *)&(this->super_cmLocalCommonGenerator).ConfigName);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)local_e8,cc_00,&local_108,(cmLocalGenerator *)this);
    std::__cxx11::string::~string((string *)&local_108);
    AppendCustomDepend(this,depends,(cmCustomCommandGenerator *)local_e8);
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_e8);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomDepends(
  std::vector<std::string>& depends, const std::vector<cmCustomCommand>& ccs)
{
  for (cmCustomCommand const& cc : ccs) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this);
    this->AppendCustomDepend(depends, ccg);
  }
}